

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O1

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
scanAdd(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
        *__return_storage_ptr__,AbstractingUnifier *au,TermSpec *t0,TermSpec *t1)

{
  undefined1 local_140 [32];
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_120 [16];
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_110 [16];
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_100 [16];
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_f0;
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_e0;
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_d0;
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_c0;
  undefined1 local_b0 [32];
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_90 [16];
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_80 [16];
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_70 [16];
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_60;
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_50;
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_40;
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  RStack_30;
  
  scan((FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
       local_b0,au,t0);
  scan((FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
       local_140,au,t1);
  add(__return_storage_ptr__,au,
      (FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *)
      local_b0,(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                *)local_140);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_c0);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_d0);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_e0);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_f0);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(local_100);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(local_110);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(local_120);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)(local_140 + 0x10));
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)local_140);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&RStack_30);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_40);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_50);
  ::Lib::
  Recycled<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_60);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(local_70);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(local_80);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(local_90);
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)(local_b0 + 0x10));
  ::Lib::
  Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled((Recycled<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RealConstantType>_>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState scanAdd(AbstractingUnifier& au, TermSpec const& t0, TermSpec const& t1) { return add(au, scan(au, t0), scan(au, t1)); }